

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesToArray
          (MessageGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  MessageOptions *this_00;
  FileDescriptor *file;
  LogMessage *other;
  string *psVar3;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  this_00 = Descriptor::options(this->descriptor_);
  bVar2 = MessageOptions::message_set_wire_format(this_00);
  if (bVar2) {
    io::Printer::Print(local_18,
                       "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n    bool deterministic, ::google::protobuf::uint8* target) const {\n  target = _extensions_.InternalSerializeMessageSetWithCachedSizesToArray(\n               deterministic, target);\n"
                       ,"classname",&this->classname_);
    file = Descriptor::file(this->descriptor_);
    bVar2 = UseUnknownFieldSet(file,&this->options_);
    local_51 = 0;
    if (!bVar2) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xe75);
      local_51 = 1;
      other = internal::LogMessage::operator<<
                        (&local_50,
                         "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=(local_65,other);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
    io::Printer::Print(local_18,
                       "  target = ::google::protobuf::internal::WireFormat::\n             SerializeUnknownMessageSetItemsToArray(\n               unknown_fields(), target);\n"
                      );
    io::Printer::Print(local_18,"  return target;\n}\n");
  }
  else {
    io::Printer::Print(local_18,
                       "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n    bool deterministic, ::google::protobuf::uint8* target) const {\n"
                       ,"classname",&this->classname_);
    io::Printer::Indent(local_18);
    pPVar1 = local_18;
    psVar3 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,"// @@protoc_insertion_point(serialize_to_array_start:$full_name$)\n",
                       "full_name",psVar3);
    GenerateSerializeWithCachedSizesBody(this,local_18,true);
    pPVar1 = local_18;
    psVar3 = Descriptor::full_name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(pPVar1,"// @@protoc_insertion_point(serialize_to_array_end:$full_name$)\n",
                       "full_name",psVar3);
    io::Printer::Outdent(local_18);
    io::Printer::Print(local_18,"  return target;\n}\n");
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizesToArray(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n"
      "    bool deterministic, ::google::protobuf::uint8* target) const {\n"
      "  target = _extensions_."
      "InternalSerializeMessageSetWithCachedSizesToArray(\n"
      "               deterministic, target);\n",
      "classname", classname_);
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "  target = ::google::protobuf::internal::WireFormat::\n"
      "             SerializeUnknownMessageSetItemsToArray(\n"
      "               unknown_fields(), target);\n");
    printer->Print(
      "  return target;\n"
      "}\n");
    return;
  }

  printer->Print(
    "::google::protobuf::uint8* $classname$::InternalSerializeWithCachedSizesToArray(\n"
    "    bool deterministic, ::google::protobuf::uint8* target) const {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "// @@protoc_insertion_point(serialize_to_array_start:$full_name$)\n",
    "full_name", descriptor_->full_name());

  GenerateSerializeWithCachedSizesBody(printer, true);

  printer->Print(
    "// @@protoc_insertion_point(serialize_to_array_end:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print(
    "  return target;\n"
    "}\n");
}